

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

SPIRVariable * __thiscall
spirv_cross::CompilerGLSL::find_subpass_input_by_attachment_index(CompilerGLSL *this,uint32_t index)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  bool bVar5;
  uint32_t uVar6;
  SPIRVariable *pSVar7;
  long lVar8;
  SPIRVariable *pSVar9;
  LoopLock loop_lock;
  LoopLock local_38;
  
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    pSVar9 = (SPIRVariable *)0x0;
  }
  else {
    pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar8 = 0;
    pSVar9 = (SPIRVariable *)0x0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar8);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeVariable) {
        pSVar7 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar1);
        bVar5 = Compiler::has_decoration
                          (&this->super_Compiler,(ID)(pSVar7->super_IVariant).self.id,
                           DecorationInputAttachmentIndex);
        if ((bVar5) &&
           (uVar6 = Compiler::get_decoration
                              (&this->super_Compiler,(ID)(pSVar7->super_IVariant).self.id,
                               DecorationInputAttachmentIndex), uVar6 == index)) {
          pSVar9 = pSVar7;
        }
      }
      lVar8 = lVar8 + 4;
    } while (sVar2 << 2 != lVar8);
  }
  ParsedIR::LoopLock::~LoopLock(&local_38);
  return pSVar9;
}

Assistant:

const SPIRVariable *CompilerGLSL::find_subpass_input_by_attachment_index(uint32_t index) const
{
	const SPIRVariable *ret = nullptr;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		if (has_decoration(var.self, DecorationInputAttachmentIndex) &&
		    get_decoration(var.self, DecorationInputAttachmentIndex) == index)
		{
			ret = &var;
		}
	});
	return ret;
}